

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

char * strnodetype(LYS_NODE type)

{
  char *pcStack_10;
  LYS_NODE type_local;
  
  if (type == LYS_UNKNOWN) {
    pcStack_10 = (char *)0x0;
  }
  else if (type == LYS_CONTAINER) {
    pcStack_10 = "container";
  }
  else if (type == LYS_CHOICE) {
    pcStack_10 = "choice";
  }
  else if (type == LYS_LEAF) {
    pcStack_10 = "leaf";
  }
  else if (type == LYS_LEAFLIST) {
    pcStack_10 = "leaf-list";
  }
  else if (type == LYS_LIST) {
    pcStack_10 = "list";
  }
  else if (type == LYS_ANYXML) {
    pcStack_10 = "anyxml";
  }
  else if (type == LYS_CASE) {
    pcStack_10 = "case";
  }
  else if (type == LYS_NOTIF) {
    pcStack_10 = "notification";
  }
  else if (type == LYS_RPC) {
    pcStack_10 = "rpc";
  }
  else if (type == LYS_INPUT) {
    pcStack_10 = "input";
  }
  else if (type == LYS_OUTPUT) {
    pcStack_10 = "output";
  }
  else if (type == LYS_GROUPING) {
    pcStack_10 = "grouping";
  }
  else if (type == LYS_USES) {
    pcStack_10 = "uses";
  }
  else if (type == LYS_AUGMENT) {
    pcStack_10 = "augment";
  }
  else if (type == LYS_ACTION) {
    pcStack_10 = "action";
  }
  else if (type == LYS_ANYDATA) {
    pcStack_10 = "anydata";
  }
  else if (type == LYS_EXT) {
    pcStack_10 = "extension instance";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char *
strnodetype(LYS_NODE type)
{
    switch (type) {
    case LYS_UNKNOWN:
        return NULL;
    case LYS_AUGMENT:
        return "augment";
    case LYS_CONTAINER:
        return "container";
    case LYS_CHOICE:
        return "choice";
    case LYS_LEAF:
        return "leaf";
    case LYS_LEAFLIST:
        return "leaf-list";
    case LYS_LIST:
        return "list";
    case LYS_ANYXML:
        return "anyxml";
    case LYS_GROUPING:
        return "grouping";
    case LYS_CASE:
        return "case";
    case LYS_INPUT:
        return "input";
    case LYS_OUTPUT:
        return "output";
    case LYS_NOTIF:
        return "notification";
    case LYS_RPC:
        return "rpc";
    case LYS_USES:
        return "uses";
    case LYS_ACTION:
        return "action";
    case LYS_ANYDATA:
        return "anydata";
    case LYS_EXT:
        return "extension instance";
    }

    return NULL;
}